

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * inject_top_level_storage_qualifier(string *expr,string *qualifier)

{
  unsigned_long uVar1;
  unsigned_long *puVar2;
  size_t in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  unsigned_long local_38;
  size_t last_significant;
  size_t last_pointer;
  size_t last_reference;
  string *qualifier_local;
  string *expr_local;
  
  last_reference = in_RDX;
  qualifier_local = qualifier;
  expr_local = expr;
  last_pointer = std::__cxx11::string::find_last_of((char)qualifier,0x26);
  last_significant = std::__cxx11::string::find_last_of((char)qualifier_local,0x2a);
  local_38 = 0xffffffffffffffff;
  uVar1 = last_significant;
  if (last_pointer != 0xffffffffffffffff) {
    if (last_significant == 0xffffffffffffffff) {
      local_38 = last_pointer;
      uVar1 = local_38;
    }
    else {
      puVar2 = std::max<unsigned_long>(&last_pointer,&last_significant);
      uVar1 = *puVar2;
    }
  }
  local_38 = uVar1;
  if (local_38 == 0xffffffffffffffff) {
    spirv_cross::join<std::__cxx11::string_const&,char_const(&)[2],std::__cxx11::string_const&>
              ((spirv_cross *)expr,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last_reference,
               (char (*) [2])0x40c6cb,qualifier_local);
  }
  else {
    std::__cxx11::string::substr((ulong)local_58,(ulong)qualifier_local);
    std::__cxx11::string::substr((ulong)local_78,(ulong)qualifier_local);
    spirv_cross::
    join<std::__cxx11::string,char_const(&)[2],std::__cxx11::string_const&,std::__cxx11::string>
              ((spirv_cross *)expr,local_58,(char (*) [2])0x40c6cb,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)last_reference,
               local_78);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_58);
  }
  return expr;
}

Assistant:

static string inject_top_level_storage_qualifier(const string &expr, const string &qualifier)
{
	// Easier to do this through text munging since the qualifier does not exist in the type system at all,
	// and plumbing in all that information is not very helpful.
	size_t last_reference = expr.find_last_of('&');
	size_t last_pointer = expr.find_last_of('*');
	size_t last_significant = string::npos;

	if (last_reference == string::npos)
		last_significant = last_pointer;
	else if (last_pointer == string::npos)
		last_significant = last_reference;
	else
		last_significant = max<size_t>(last_reference, last_pointer);

	if (last_significant == string::npos)
		return join(qualifier, " ", expr);
	else
	{
		return join(expr.substr(0, last_significant + 1), " ",
		            qualifier, expr.substr(last_significant + 1, string::npos));
	}
}